

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::
     AddGenericArgMinMaxFunction<duckdb::VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>>
               (AggregateFunctionSet *fun)

{
  AggregateFunction *in_RDI;
  AggregateFunction *this;
  AggregateFunction local_138;
  
  this = &local_138;
  GetGenericArgMinMaxFunction<duckdb::VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>>
            ();
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_RDI);
  AggregateFunction::~AggregateFunction(this);
  return;
}

Assistant:

void AddGenericArgMinMaxFunction(AggregateFunctionSet &fun) {
	fun.AddFunction(GetGenericArgMinMaxFunction<OP>());
}